

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkwrite.c
# Opt level: O0

int pk_write_ec_param(uchar **p,uchar *start,mbedtls_ecp_keypair *ec)

{
  size_t local_48;
  size_t oid_len;
  char *oid;
  size_t len;
  mbedtls_ecp_keypair *pmStack_28;
  int ret;
  mbedtls_ecp_keypair *ec_local;
  uchar *start_local;
  uchar **p_local;
  
  len._4_4_ = 0xffffff92;
  oid = (char *)0x0;
  pmStack_28 = ec;
  ec_local = (mbedtls_ecp_keypair *)start;
  start_local = (uchar *)p;
  len._4_4_ = mbedtls_oid_get_oid_by_ec_grp((ec->grp).id,(char **)&oid_len,&local_48);
  p_local._4_4_ = len._4_4_;
  if ((len._4_4_ == 0) &&
     (p_local._4_4_ =
           mbedtls_asn1_write_oid((uchar **)start_local,(uchar *)ec_local,(char *)oid_len,local_48),
     -1 < p_local._4_4_)) {
    p_local._4_4_ = p_local._4_4_ + (int)oid;
  }
  return p_local._4_4_;
}

Assistant:

static int pk_write_ec_param( unsigned char **p, unsigned char *start,
                              mbedtls_ecp_keypair *ec )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len = 0;
    const char *oid;
    size_t oid_len;

    if( ( ret = mbedtls_oid_get_oid_by_ec_grp( ec->grp.id, &oid, &oid_len ) ) != 0 )
        return( ret );

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_oid( p, start, oid, oid_len ) );

    return( (int) len );
}